

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O2

FVoxel * R_LoadKVX(int lumpnum)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  FVoxel *this;
  int *piVar7;
  ulong uVar8;
  int *piVar9;
  BYTE **ppBVar10;
  double *pdVar11;
  BYTE *pBVar12;
  FString FVar13;
  uint *puVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  kvxslab_t *pkVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  int j;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  bool bVar29;
  FMemLump lump;
  kvxslab_t *slabs [5];
  
  this = (FVoxel *)operator_new(0x158);
  FVoxel::FVoxel(this);
  FWadCollection::ReadLump((FWadCollection *)&lump,0x1c6a4b0);
  iVar2 = *(int *)((long)lump.Block.Chars + -0xc);
  if (iVar2 == 0) {
    lump.Block.Chars = (FString)(char *)0x0;
  }
  iVar5 = iVar2 + -0x305;
  ppBVar10 = &this->Palette;
  FVar13 = lump.Block.Chars;
  for (uVar8 = 0; puVar14 = (uint *)FVar13.Chars, uVar8 != 5; uVar8 = uVar8 + 1) {
    uVar6 = *(uint *)FVar13.Chars;
    if ((iVar5 < (int)uVar6) || ((int)uVar6 < 0x18)) {
LAB_004fec16:
      if (uVar8 == 0) goto LAB_004fec35;
      break;
    }
    puVar14 = (uint *)((long)FVar13.Chars + 4);
    uVar21 = *(uint *)((long)FVar13.Chars + 4);
    lVar15 = (long)(int)uVar21;
    this->Mips[uVar8].SizeX = uVar21;
    uVar3 = *(uint *)((long)FVar13.Chars + 8);
    this->Mips[uVar8].SizeY = uVar3;
    this->Mips[uVar8].SizeZ = *(uint *)((long)FVar13.Chars + 0xc);
    this->Mips[uVar8].Pivot.X = (double)(int)*(uint *)((long)FVar13.Chars + 0x10) * 0.00390625;
    this->Mips[uVar8].Pivot.Y = (double)(int)*(uint *)((long)FVar13.Chars + 0x14) * 0.00390625;
    this->Mips[uVar8].Pivot.Z = (double)(int)*(uint *)((long)FVar13.Chars + 0x18) * 0.00390625;
    uVar27 = (uVar3 + 1) * uVar21;
    iVar26 = uVar27 * 2 + uVar21 * 4 + 4;
    uVar28 = (uVar6 - 0x18) - iVar26;
    if ((int)uVar28 < 0) goto LAB_004fec16;
    if (uVar6 - 0x18 != iVar26) {
      piVar7 = (int *)operator_new__((ulong)(uVar6 - 0x15 & 0xfffffffc));
      this->Mips[uVar8].OffsetX = piVar7;
      piVar9 = piVar7 + lVar15 + 1;
      this->Mips[uVar8].OffsetXY = (short *)piVar9;
      this->Mips[uVar8].SlabData = (BYTE *)((long)(piVar7 + lVar15) + (long)(int)uVar27 * 2 + 4);
      iVar16 = 0;
      lVar22 = 0;
      for (lVar23 = 0; lVar23 <= lVar15; lVar23 = lVar23 + 1) {
        *(int *)((long)piVar7 + lVar22) = *(int *)((long)FVar13.Chars + lVar22 + 0x1c) - iVar26;
        lVar22 = lVar22 + 4;
        iVar16 = iVar16 + 1;
      }
      if ((*piVar7 != 0) || (piVar7[lVar15] != uVar28)) goto LAB_004fec16;
      if ((int)uVar27 < 1) {
        uVar27 = 0;
      }
      for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
        *(undefined2 *)((long)piVar9 + uVar19 * 2) =
             *(undefined2 *)((long)FVar13.Chars + uVar19 * 2 + (ulong)(uint)(iVar16 << 2) + 0x1c);
      }
      uVar17 = 0;
      uVar19 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar19 = uVar17;
      }
      uVar25 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar25 = uVar17;
      }
      for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
        uVar24 = 0;
        while (uVar25 != uVar24) {
          lVar15 = uVar24 * 2;
          uVar24 = uVar24 + 1;
          if (uVar28 < (uint)((int)*(short *)((long)piVar9 + lVar15 + (long)(int)uVar17 * 2) +
                             piVar7[uVar20])) goto LAB_004fec35;
        }
        uVar17 = (ulong)((int)uVar17 + uVar3 + 1);
      }
      slabs[uVar8] = (kvxslab_t *)((long)FVar13.Chars + (long)iVar26 + 0x1c);
    }
    FVar13.Chars = (char *)((long)puVar14 + (ulong)uVar6);
    iVar5 = (iVar5 - uVar6) + -4;
    ppBVar10 = ppBVar10 + 8;
  }
  if (puVar14 == (uint *)((long)lump.Block.Chars + (long)(iVar2 + -1) + -0x300)) {
    uVar8 = uVar8 & 0xffffffff;
    do {
      if ((long)uVar8 < 1) {
        uVar6 = 0;
        goto LAB_004fec85;
      }
      uVar8 = uVar8 - 1;
      pBVar12 = *ppBVar10;
      ppBVar10 = ppBVar10 + -8;
    } while (pBVar12 == (BYTE *)0x0);
    uVar6 = (int)uVar8 + 1;
LAB_004fec85:
    this->NumMips = uVar6;
    pdVar11 = &this->Mips[1].Pivot.Z;
    for (lVar15 = 1; lVar15 < (int)uVar6; lVar15 = lVar15 + 1) {
      *pdVar11 = pdVar11[-8] * 0.5;
      dVar4 = pdVar11[-9];
      ((DVector3 *)(pdVar11 + -2))->X = pdVar11[-10] * 0.5;
      pdVar11[-1] = dVar4 * 0.5;
      pdVar11 = pdVar11 + 8;
    }
    uVar19 = 0;
    uVar8 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar8 = uVar19;
    }
    for (; uVar19 != uVar8; uVar19 = uVar19 + 1) {
      pBVar12 = this->Mips[uVar19].SlabData;
      pkVar18 = slabs[uVar19];
      uVar6 = this->Mips[uVar19].OffsetX[this->Mips[uVar19].SizeX];
      while (2 < (int)uVar6) {
        bVar1 = pkVar18->zleng;
        uVar17 = (ulong)bVar1;
        uVar21 = (uint)(uVar17 + 3);
        bVar29 = uVar6 < uVar21;
        uVar6 = uVar6 - uVar21;
        if (bVar29) goto LAB_004fec35;
        *pBVar12 = pkVar18->ztop;
        pBVar12[1] = bVar1;
        pBVar12[2] = pkVar18->backfacecull;
        for (uVar25 = 0; uVar17 != uVar25; uVar25 = uVar25 + 1) {
          pBVar12[uVar25 + 3] = pkVar18->col[uVar25];
        }
        pkVar18 = (kvxslab_t *)(pkVar18->col + uVar17);
        pBVar12 = pBVar12 + uVar17 + 3;
      }
    }
    this->LumpNum = lumpnum;
    pBVar12 = (BYTE *)operator_new__(0x300);
    this->Palette = pBVar12;
    memcpy(pBVar12,(uint *)((long)lump.Block.Chars + (long)(iVar2 + -1) + -0x300),0x300);
  }
  else {
LAB_004fec35:
    FVoxel::~FVoxel(this);
    operator_delete(this,0x158);
    this = (FVoxel *)0x0;
  }
  FMemLump::~FMemLump(&lump);
  return this;
}

Assistant:

FVoxel *R_LoadKVX(int lumpnum)
{
	const kvxslab_t *slabs[MAXVOXMIPS];
	FVoxel *voxel = new FVoxel;
	const BYTE *rawmip;
	int mip, maxmipsize;
	int i, j, n;

	FMemLump lump = Wads.ReadLump(lumpnum);	// FMemLump adds an extra 0 byte to the end.
	BYTE *rawvoxel = (BYTE *)lump.GetMem();
	int voxelsize = (int)(lump.GetSize()-1);

	// Oh, KVX, why couldn't you have a proper header? We'll just go through
	// and collect each MIP level, doing lots of range checking, and if the
	// last one doesn't end exactly 768 bytes before the end of the file,
	// we'll reject it.

	for (mip = 0, rawmip = rawvoxel, maxmipsize = voxelsize - 768 - 4;
		 mip < MAXVOXMIPS;
		 mip++)
	{
		int numbytes = GetInt(rawmip);
		if (numbytes > maxmipsize || numbytes < 24)
		{
			break;
		}
		rawmip += 4;

		FVoxelMipLevel *mipl = &voxel->Mips[mip];

		// Load header data.
		mipl->SizeX = GetInt(rawmip + 0);
		mipl->SizeY = GetInt(rawmip + 4);
		mipl->SizeZ = GetInt(rawmip + 8);
		mipl->Pivot.X = GetInt(rawmip + 12) / 256.;
		mipl->Pivot.Y = GetInt(rawmip + 16) / 256.;
		mipl->Pivot.Z = GetInt(rawmip + 20) / 256.;

		// How much space do we have for voxdata?
		int offsetsize = (mipl->SizeX + 1) * 4 + mipl->SizeX * (mipl->SizeY + 1) * 2;
		int voxdatasize = numbytes - 24 - offsetsize;
		if (voxdatasize < 0)
		{ // Clearly, not enough.
			break;
		}
		if (voxdatasize != 0)
		{	// This mip level is not empty.
			// Allocate slab data space.
			mipl->OffsetX = new int[(numbytes - 24 + 3) / 4];
			mipl->OffsetXY = (short *)(mipl->OffsetX + mipl->SizeX + 1);
			mipl->SlabData = (BYTE *)(mipl->OffsetXY + mipl->SizeX * (mipl->SizeY + 1));

			// Load x offsets.
			for (i = 0, n = mipl->SizeX; i <= n; ++i)
			{
				// The X offsets stored in the KVX file are relative to the start of the
				// X offsets array. Make them relative to voxdata instead.
				mipl->OffsetX[i] = GetInt(rawmip + 24 + i * 4) - offsetsize;
			}

			// The first X offset must be 0 (since we subtracted offsetsize), according to the spec:
			//		NOTE: xoffset[0] = (xsiz+1)*4 + xsiz*(ysiz+1)*2 (ALWAYS)
			if (mipl->OffsetX[0] != 0)
			{
				break;
			}
			// And the final X offset must point just past the end of the voxdata.
			if (mipl->OffsetX[mipl->SizeX] != voxdatasize)
			{
				break;
			}

			// Load xy offsets.
			i = 24 + i * 4;
			for (j = 0, n *= mipl->SizeY + 1; j < n; ++j)
			{
				mipl->OffsetXY[j] = GetShort(rawmip + i + j * 2);
			}

			// Ensure all offsets are within bounds.
			for (i = 0; i < mipl->SizeX; ++i)
			{
				int xoff = mipl->OffsetX[i];
				for (j = 0; j < mipl->SizeY; ++j)
				{
					int yoff = mipl->OffsetXY[(mipl->SizeY + 1) * i + j];
					if (unsigned(xoff + yoff) > unsigned(voxdatasize))
					{
						delete voxel;
						return NULL;
					}
				}
			}

			// Record slab location for the end.
			slabs[mip] = (kvxslab_t *)(rawmip + 24 + offsetsize);
		}

		// Time for the next mip Level.
		rawmip += numbytes;
		maxmipsize -= numbytes + 4;
	}